

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v9::detail::bigint::align(bigint *this,bigint *other)

{
  uint uVar1;
  type tVar2;
  size_t sVar3;
  uint *puVar4;
  int local_2c;
  int local_28;
  int local_24;
  int j;
  int i;
  int num_bigits;
  int exp_difference;
  bigint *other_local;
  bigint *this_local;
  
  i = this->exp_ - other->exp_;
  if (0 < i) {
    _num_bigits = other;
    other_local = this;
    sVar3 = buffer<unsigned_int>::size((buffer<unsigned_int> *)this);
    j = (int)sVar3;
    tVar2 = to_unsigned<int>(j + i);
    basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
              (&this->bigits_,(ulong)tVar2);
    local_24 = j + -1;
    local_28 = local_24 + i;
    for (; -1 < local_24; local_24 = local_24 + -1) {
      puVar4 = buffer<unsigned_int>::operator[]<int>((buffer<unsigned_int> *)this,local_24);
      uVar1 = *puVar4;
      puVar4 = buffer<unsigned_int>::operator[]<int>((buffer<unsigned_int> *)this,local_28);
      *puVar4 = uVar1;
      local_28 = local_28 + -1;
    }
    puVar4 = buffer<unsigned_int>::data((buffer<unsigned_int> *)this);
    local_2c = 0;
    std::uninitialized_fill_n<unsigned_int*,int,int>(puVar4,i,&local_2c);
    this->exp_ = this->exp_ - i;
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void align(const bigint& other) {
    int exp_difference = exp_ - other.exp_;
    if (exp_difference <= 0) return;
    int num_bigits = static_cast<int>(bigits_.size());
    bigits_.resize(to_unsigned(num_bigits + exp_difference));
    for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
      bigits_[j] = bigits_[i];
    std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
    exp_ -= exp_difference;
  }